

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayoutInfo::findSeparator
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QPoint *_pos)

{
  int iVar1;
  Orientation OVar2;
  undefined1 auVar3 [16];
  Representation RVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  QPoint *pQVar11;
  QSize QVar12;
  QSize QVar13;
  long lVar14;
  QDockAreaLayoutItem *this_00;
  Representation index;
  ulong uVar15;
  Representation RVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  Representation local_70;
  undefined1 local_68 [12];
  Representation RStack_5c;
  undefined1 local_58 [16];
  undefined1 *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed == false) {
    pQVar11 = (QPoint *)&_pos->yp;
    if (this->o == Horizontal) {
      pQVar11 = _pos;
    }
    if ((this->item_list).d.size != 0) {
      iVar1 = (pQVar11->xp).m_i;
      uVar19 = 1;
      lVar14 = 0x28;
      uVar15 = 0;
      do {
        this_00 = (this->item_list).d.ptr + uVar15;
        bVar8 = QDockAreaLayoutItem::skip(this_00);
        bVar9 = false;
        if ((!bVar8) && ((this_00->flags & 1) == 0)) {
          index.m_i = (int)uVar15;
          lVar17 = lVar14;
          uVar20 = uVar19;
          if ((iVar1 < this_00->size + this_00->pos) &&
             (this_00->subinfo != (QDockAreaLayoutInfo *)0x0)) {
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            findSeparator((QList<int> *)local_58,this_00->subinfo,_pos);
            if (local_48 == (undefined1 *)0x0) {
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = (int *)0x0;
              (__return_storage_ptr__->d).size = 0;
            }
            else {
              local_68._0_4_ = index.m_i;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)local_58,0,(int *)local_68);
              puVar7 = local_48;
              uVar5 = local_58._0_8_;
              uVar6 = local_58._8_8_;
              local_58 = (undefined1  [16])0x0;
              (__return_storage_ptr__->d).d = (Data *)uVar5;
              (__return_storage_ptr__->d).ptr = (int *)uVar6;
              local_48 = (undefined1 *)0x0;
              (__return_storage_ptr__->d).size = (qsizetype)puVar7;
            }
LAB_003f9294:
            if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_58._0_8_,4,0x10);
              }
            }
            bVar9 = true;
          }
          else {
            do {
              if ((ulong)(this->item_list).d.size <= uVar20) {
                iVar18 = -1;
                goto LAB_003f912b;
              }
              bVar9 = QDockAreaLayoutItem::skip
                                ((QDockAreaLayoutItem *)
                                 ((long)&((this->item_list).d.ptr)->widgetItem + lVar17));
              uVar20 = uVar20 + 1;
              lVar17 = lVar17 + 0x28;
            } while (bVar9);
            iVar18 = (int)uVar20 + -1;
LAB_003f912b:
            bVar9 = false;
            if ((iVar18 != -1) && (((this->item_list).d.ptr[iVar18].flags & 1) == 0)) {
              stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
              local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              _local_68 = separatorRect(this,index.m_i);
              auVar3._4_4_ = -(uint)(local_68._8_4_ == local_68._0_4_ + -1);
              auVar3._0_4_ = -(uint)(local_68._8_4_ == local_68._0_4_ + -1);
              auVar3._8_4_ = -(uint)(RStack_5c.m_i == local_68._4_4_ + -1);
              auVar3._12_4_ = -(uint)(RStack_5c.m_i == local_68._4_4_ + -1);
              iVar18 = movmskpd(local_68._0_4_,auVar3);
              if ((iVar18 != 3) && (*this->sep == 1)) {
                local_68._4_4_ = local_68._4_4_ + -2;
                local_68._0_4_ = local_68._0_4_ + -2;
                local_68._8_4_ = local_68._8_4_ + 2;
                RStack_5c.m_i = RStack_5c.m_i + 2;
              }
              bVar9 = false;
              cVar10 = QRect::contains((QPoint *)local_68,SUB81(_pos,0));
              if (cVar10 != '\0') {
                OVar2 = this->o;
                QVar12 = QDockAreaLayoutItem::minimumSize(this_00);
                QVar13 = QDockAreaLayoutItem::maximumSize(this_00);
                bVar9 = OVar2 == Vertical;
                local_70 = QVar12.wd.m_i;
                RVar16.m_i = QVar12.ht.m_i.m_i;
                if (bVar9) {
                  RVar16.m_i = local_70.m_i;
                }
                RVar4 = QVar13.ht.m_i;
                if (bVar9) {
                  RVar4 = QVar13.wd.m_i;
                }
                bVar9 = false;
                if (RVar16.m_i != RVar4.m_i) {
                  local_58 = (undefined1  [16])0x0;
                  local_48 = (undefined1 *)0x0;
                  local_3c = index.m_i;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)local_58,0,&local_3c);
                  QList<int>::end((QList<int> *)local_58);
                  (__return_storage_ptr__->d).d = (Data *)local_58._0_8_;
                  (__return_storage_ptr__->d).ptr = (int *)local_58._8_8_;
                  (__return_storage_ptr__->d).size = (qsizetype)local_48;
                  if ((Data *)local_58._0_8_ != (Data *)0x0) {
                    LOCK();
                    (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                         (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  goto LAB_003f9294;
                }
              }
            }
          }
        }
        if (bVar9) goto LAB_003f92ec;
        uVar15 = uVar15 + 1;
        uVar19 = uVar19 + 1;
        lVar14 = lVar14 + 0x28;
      } while (uVar15 < (ulong)(this->item_list).d.size);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_003f92ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QDockAreaLayoutInfo::findSeparator(const QPoint &_pos) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QList<int>();
#endif

    int pos = pick(o, _pos);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip() || (item.flags & QDockAreaLayoutItem::GapItem))
            continue;

        if (item.pos + item.size > pos) {
            if (item.subinfo != nullptr) {
                QList<int> result = item.subinfo->findSeparator(_pos);
                if (!result.isEmpty()) {
                    result.prepend(i);
                    return result;
                } else {
                    return QList<int>();
                }
            }
        }

        int next = this->next(i);
        if (next == -1 || (item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            continue;

        QRect sepRect = separatorRect(i);
        if (!sepRect.isNull() && *sep == 1)
            sepRect.adjust(-2, -2, 2, 2);
        //we also make sure we don't find a separator that's not there
        if (sepRect.contains(_pos) && !item.hasFixedSize(o)) {
            return QList<int>() << i;
        }

    }

    return QList<int>();
}